

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O2

bool __thiscall
IRT::RegModRegPattern::TryToGenerateCode
          (RegModRegPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  TOperationType TVar1;
  CBinopExpression *this_00;
  CExpression *pCVar2;
  CTempExpression *pCVar3;
  CTemp leftRegister;
  pair<IRT::CTemp,_const_IRT::INode_*> pStack_98;
  CTemp local_70;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_50;
  
  if (tree != (INode *)0x0) {
    this_00 = (CBinopExpression *)
              __dynamic_cast(tree,&INode::typeinfo,&CBinopExpression::typeinfo,0);
    if (this_00 == (CBinopExpression *)0x0) {
      return false;
    }
    TVar1 = CBinopExpression::getOperation(this_00);
    if (TVar1 == MOD) {
      pCVar2 = CBinopExpression::getLeftOperand(this_00);
      if ((pCVar2 == (CExpression *)0x0) ||
         (pCVar3 = (CTempExpression *)
                   __dynamic_cast(pCVar2,&CExpression::typeinfo,&CTempExpression::typeinfo,0),
         pCVar3 == (CTempExpression *)0x0)) {
        CTemp::CTemp(&local_70);
        pCVar2 = CBinopExpression::getLeftOperand(this_00);
        std::__cxx11::string::string((string *)&local_50,(string *)&local_70);
        local_50.second = pCVar2;
        std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                  (&pStack_98,&local_50);
        std::
        vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
        ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                  ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                    *)children,&pStack_98);
        std::__cxx11::string::~string((string *)&pStack_98);
        std::__cxx11::string::~string((string *)&local_50);
        std::make_shared<AssemblyCode::MoveRegRegCommand,IRT::CTemp_const&,IRT::CTemp&>
                  (&pStack_98.first,dest);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegRegCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands,(shared_ptr<AssemblyCode::MoveRegRegCommand> *)&pStack_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &pStack_98.first.name._M_string_length);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        CTempExpression::getTemprorary(pCVar3);
        std::make_shared<AssemblyCode::MoveRegRegCommand,IRT::CTemp_const&,IRT::CTemp_const&>
                  (&pStack_98.first,dest);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegRegCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands,(shared_ptr<AssemblyCode::MoveRegRegCommand> *)&pStack_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &pStack_98.first.name._M_string_length);
      }
      pCVar2 = CBinopExpression::getRightOperand(this_00);
      if ((pCVar2 == (CExpression *)0x0) ||
         (pCVar3 = (CTempExpression *)
                   __dynamic_cast(pCVar2,&CExpression::typeinfo,&CTempExpression::typeinfo,0),
         pCVar3 == (CTempExpression *)0x0)) {
        CTemp::CTemp(&local_70);
        pCVar2 = CBinopExpression::getRightOperand(this_00);
        std::__cxx11::string::string((string *)&local_50,(string *)&local_70);
        local_50.second = pCVar2;
        std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                  (&pStack_98,&local_50);
        std::
        vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
        ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                  ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                    *)children,&pStack_98);
        std::__cxx11::string::~string((string *)&pStack_98);
        std::__cxx11::string::~string((string *)&local_50);
        std::make_shared<AssemblyCode::DivRegRegCommand,IRT::CTemp_const&,IRT::CTemp&>
                  (&pStack_98.first,dest);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::DivRegRegCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands,(shared_ptr<AssemblyCode::DivRegRegCommand> *)&pStack_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &pStack_98.first.name._M_string_length);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        CTempExpression::getTemprorary(pCVar3);
        std::make_shared<AssemblyCode::DivRegRegCommand,IRT::CTemp_const&,IRT::CTemp_const&>
                  (&pStack_98.first,dest);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::DivRegRegCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands,(shared_ptr<AssemblyCode::DivRegRegCommand> *)&pStack_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &pStack_98.first.name._M_string_length);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool IRT::RegModRegPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                               AssemblyCommands &commands ) {
    ConstBinopPtr binopPtr = dynamic_cast<ConstBinopPtr>(tree);
    if ( binopPtr && binopPtr->getOperation( ) == IRT::enums::TOperationType::MOD ) {
        ConstTempPtr leftRegisterPtr = dynamic_cast<ConstTempPtr>(binopPtr->getLeftOperand( ));
        if ( leftRegisterPtr ) {
            commands.emplace_back(
                    std::make_shared<AssemblyCode::MoveRegRegCommand>( dest, leftRegisterPtr->getTemprorary( )));
        } else {
            CTemp leftRegister;
            children.push_back( std::make_pair( leftRegister, binopPtr->getLeftOperand( )));
            commands.emplace_back( std::make_shared<AssemblyCode::MoveRegRegCommand>( dest, leftRegister ));
        }
        ConstTempPtr rightRegisterPtr = dynamic_cast<ConstTempPtr>(binopPtr->getRightOperand( ));
        if ( rightRegisterPtr ) {
            commands.emplace_back(
                    std::make_shared<AssemblyCode::DivRegRegCommand>( dest, rightRegisterPtr->getTemprorary( )));
        } else {
            CTemp rightRegister;
            children.push_back( std::make_pair( rightRegister, binopPtr->getRightOperand( )));
            commands.emplace_back( std::make_shared<AssemblyCode::DivRegRegCommand>( dest, rightRegister ));
        }
        return true;
    }
    return false;
}